

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# generator.cpp
# Opt level: O0

QMap<int,_QMultiMap<QByteArray,_int>_> __thiscall
Generator::methodsWithAutomaticTypesHelper(Generator *this,QList<FunctionDef> *methodList)

{
  long lVar1;
  bool bVar2;
  qsizetype qVar3;
  const_reference pFVar4;
  QList<FunctionDef> *in_RDX;
  QByteArray *in_RSI;
  QExplicitlySharedDataPointerV2<QMapData<std::map<int,_QMultiMap<QByteArray,_int>,_std::less<int>,_std::allocator<std::pair<const_int,_QMultiMap<QByteArray,_int>_>_>_>_>_>
  in_RDI;
  long in_FS_OFFSET;
  QByteArray *argType;
  FunctionDef *f;
  QMap<int,_QMultiMap<QByteArray,_int>_> *methodsWithAutomaticTypes;
  int j;
  int i;
  QByteArray *in_stack_ffffffffffffff88;
  QList<FunctionDef> *in_stack_ffffffffffffff90;
  iterator in_stack_ffffffffffffffb8;
  int local_10;
  int local_c;
  
  lVar1 = *(long *)(in_FS_OFFSET + 0x28);
  *(undefined1 **)in_RDI.d.ptr = &DAT_aaaaaaaaaaaaaaaa;
  QMap<int,_QMultiMap<QByteArray,_int>_>::QMap((QMap<int,_QMultiMap<QByteArray,_int>_> *)0x1132e0);
  for (local_c = 0; qVar3 = QList<FunctionDef>::size(in_RDX), local_c < qVar3; local_c = local_c + 1
      ) {
    pFVar4 = QList<FunctionDef>::at(in_stack_ffffffffffffff90,(qsizetype)in_stack_ffffffffffffff88);
    local_10 = 0;
    while( true ) {
      in_stack_ffffffffffffff90 = (QList<FunctionDef> *)(long)local_10;
      qVar3 = QList<ArgumentDef>::size(&pFVar4->arguments);
      if (qVar3 <= (long)in_stack_ffffffffffffff90) break;
      QList<ArgumentDef>::at
                ((QList<ArgumentDef> *)in_stack_ffffffffffffff90,
                 (qsizetype)in_stack_ffffffffffffff88);
      bVar2 = registerableMetaType((Generator *)methodsWithAutomaticTypes,(QByteArray *)this);
      if ((bVar2) && (bVar2 = isBuiltinType(in_stack_ffffffffffffff88), !bVar2)) {
        QMap<int,_QMultiMap<QByteArray,_int>_>::operator[]
                  ((QMap<int,_QMultiMap<QByteArray,_int>_> *)in_stack_ffffffffffffffb8._M_node,
                   (int *)in_RSI);
        in_stack_ffffffffffffffb8._M_node =
             (_Base_ptr)
             QMultiMap<QByteArray,_int>::insert
                       (in_stack_ffffffffffffffb8._M_node,in_RSI,(int *)in_RDI.d.ptr);
      }
      local_10 = local_10 + 1;
    }
  }
  if (*(long *)(in_FS_OFFSET + 0x28) == lVar1) {
    return (QExplicitlySharedDataPointerV2<QMapData<std::map<int,_QMultiMap<QByteArray,_int>,_std::less<int>,_std::allocator<std::pair<const_int,_QMultiMap<QByteArray,_int>_>_>_>_>_>
            )(QExplicitlySharedDataPointerV2<QMapData<std::map<int,_QMultiMap<QByteArray,_int>,_std::less<int>,_std::allocator<std::pair<const_int,_QMultiMap<QByteArray,_int>_>_>_>_>_>
              )in_RDI.d.ptr;
  }
  __stack_chk_fail();
}

Assistant:

QMap<int, QMultiMap<QByteArray, int>>
Generator::methodsWithAutomaticTypesHelper(const QList<FunctionDef> &methodList)
{
    QMap<int, QMultiMap<QByteArray, int> > methodsWithAutomaticTypes;
    for (int i = 0; i < methodList.size(); ++i) {
        const FunctionDef &f = methodList.at(i);
        for (int j = 0; j < f.arguments.size(); ++j) {
            const QByteArray &argType = f.arguments.at(j).normalizedType;
            if (registerableMetaType(argType) && !isBuiltinType(argType))
                methodsWithAutomaticTypes[i].insert(argType, j);
        }
    }
    return methodsWithAutomaticTypes;
}